

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

double fcssx(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  void *__dest;
  void *__dest_00;
  void *pvVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  double *pdVar21;
  double dVar22;
  double dVar23;
  
  uVar20 = *params;
  lVar14 = (long)(int)uVar20;
  iVar12 = *(int *)((long)params + 0xc);
  lVar13 = (long)iVar12;
  uVar1 = *(uint *)((long)params + 0x10);
  uVar18 = *(uint *)((long)params + 0x18);
  iVar7 = uVar1 * iVar12;
  uVar8 = iVar7 + uVar20;
  uVar2 = *(uint *)((long)params + 8);
  uVar10 = uVar18 * iVar12 + uVar2;
  uVar3 = *(uint *)((long)params + 0x28);
  uVar4 = *(uint *)((long)params + 0x2c);
  iVar5 = *(int *)((long)params + 0x58);
  __dest = malloc((long)(int)uVar8 << 3);
  __dest_00 = malloc((long)(int)uVar10 << 3);
  if (0 < lVar14) {
    memcpy(__dest,b,(ulong)uVar20 * 8);
  }
  if (0 < iVar7) {
    uVar6 = uVar20 + 1;
    if ((int)(uVar20 + 1) < (int)uVar8) {
      uVar6 = uVar8;
    }
    memset((void *)((long)__dest + lVar14 * 8),0,(ulong)(~uVar20 + uVar6) * 8 + 8);
  }
  if (0 < (int)uVar2) {
    memcpy(__dest_00,b + lVar14,(ulong)uVar2 * 8);
  }
  if (0 < (int)(uVar18 * iVar12)) {
    uVar6 = uVar2 + 1;
    if ((int)(uVar2 + 1) < (int)uVar10) {
      uVar6 = uVar10;
    }
    memset((void *)((long)__dest_00 + (long)(int)uVar2 * 8),0,(ulong)(~uVar2 + uVar6) * 8 + 8);
  }
  if (0 < (int)uVar1) {
    pvVar9 = (void *)((long)__dest + lVar13 * 8);
    uVar15 = 0;
    do {
      dVar22 = b[(long)(int)(uVar2 + uVar20) + uVar15];
      uVar15 = uVar15 + 1;
      *(double *)((long)__dest + uVar15 * lVar13 * 8 + -8) =
           *(double *)((long)__dest + uVar15 * lVar13 * 8 + -8) + dVar22;
      if (0 < (int)uVar20) {
        uVar17 = 0;
        do {
          *(double *)((long)pvVar9 + uVar17 * 8) =
               *(double *)((long)pvVar9 + uVar17 * 8) - b[uVar17] * dVar22;
          uVar17 = uVar17 + 1;
        } while (uVar20 != uVar17);
      }
      pvVar9 = (void *)((long)pvVar9 + lVar13 * 8);
    } while (uVar15 != uVar1);
  }
  iVar12 = uVar2 + uVar20 + uVar1;
  if (0 < (int)uVar18) {
    pvVar9 = (void *)((long)__dest_00 + lVar13 * 8);
    uVar15 = 0;
    do {
      dVar22 = b[(long)iVar12 + uVar15];
      uVar15 = uVar15 + 1;
      *(double *)((long)__dest_00 + uVar15 * lVar13 * 8 + -8) =
           *(double *)((long)__dest_00 + uVar15 * lVar13 * 8 + -8) + dVar22;
      if (0 < (int)uVar2) {
        uVar17 = 0;
        do {
          *(double *)((long)pvVar9 + uVar17 * 8) =
               b[(long)(int)uVar20 + uVar17] * dVar22 + *(double *)((long)pvVar9 + uVar17 * 8);
          uVar17 = uVar17 + 1;
        } while (uVar2 != uVar17);
      }
      pvVar9 = (void *)((long)pvVar9 + lVar13 * 8);
    } while (uVar15 != uVar18);
  }
  if (0 < (int)uVar8) {
    uVar15 = 0;
    do {
      *(undefined8 *)((long)params + uVar15 * 8 + (long)(int)(uVar3 + iVar5) * 8 + 0x60) = 0;
      uVar15 = uVar15 + 1;
    } while (uVar8 != uVar15);
  }
  if (0 < (int)uVar3 && 0 < (int)uVar4) {
    pdVar16 = (double *)((long)params + (long)(int)(uVar3 * 3 + iVar5) * 8 + 0x60);
    uVar15 = 0;
    do {
      dVar22 = *(double *)((long)params + (uVar15 + (long)(int)(iVar5 + uVar3 * 2)) * 8 + 0x60);
      uVar17 = 0;
      pdVar21 = pdVar16;
      do {
        dVar22 = dVar22 - *pdVar21 * b[(long)(int)(iVar12 + uVar18) + uVar17];
        uVar17 = uVar17 + 1;
        pdVar21 = pdVar21 + uVar3;
      } while (uVar4 != uVar17);
      *(double *)((long)params + (uVar15 + (long)iVar5) * 8 + 0x60) = dVar22;
      uVar15 = uVar15 + 1;
      pdVar16 = pdVar16 + 1;
    } while (uVar15 != uVar3);
  }
  if ((int)uVar8 < (int)uVar3) {
    lVar14 = iVar7 + lVar14;
    lVar13 = ((ulong)(uVar20 + iVar5 + iVar7) << 0x20) + -0x100000000;
    lVar11 = ((ulong)(uVar3 + iVar5 + (int)lVar14) << 0x20) + -0x100000000;
    uVar20 = 0;
    dVar22 = 0.0;
    do {
      uVar1 = uVar10;
      if ((int)uVar20 < (int)uVar10) {
        uVar1 = uVar20;
      }
      dVar23 = *(double *)((long)params + (lVar14 + iVar5) * 8 + 0x60);
      if (0 < (int)uVar8) {
        uVar15 = 0;
        lVar19 = lVar13;
        do {
          dVar23 = dVar23 - *(double *)((long)__dest + uVar15 * 8) *
                            *(double *)((long)params + (lVar19 >> 0x1d) + 0x60);
          uVar15 = uVar15 + 1;
          lVar19 = lVar19 + -0x100000000;
        } while (uVar8 != uVar15);
      }
      uVar18 = (int)lVar14 - uVar8;
      if ((int)uVar10 <= (int)uVar18) {
        uVar18 = uVar10;
      }
      if (0 < (int)uVar18) {
        uVar15 = 0;
        lVar19 = lVar11;
        do {
          dVar23 = dVar23 - *(double *)((long)__dest_00 + uVar15 * 8) *
                            *(double *)((long)params + (lVar19 >> 0x1d) + 0x60);
          uVar15 = uVar15 + 1;
          lVar19 = lVar19 + -0x100000000;
        } while (uVar1 != uVar15);
      }
      uVar20 = uVar20 + 1;
      *(double *)((long)params + (lVar14 + (int)(uVar3 + iVar5)) * 8 + 0x60) = dVar23;
      dVar22 = dVar22 + dVar23 * dVar23;
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x100000000;
      lVar11 = lVar11 + 0x100000000;
    } while (lVar14 < (int)uVar3);
  }
  else {
    dVar22 = 0.0;
    uVar20 = 0;
  }
  *(double *)((long)params + 0x48) = dVar22;
  *(uint *)((long)params + 0x30) = uVar20;
  dVar22 = log(dVar22 / (double)(int)uVar20);
  *(double *)((long)params + 0x50) = dVar22 * 0.5;
  free(__dest);
  free(__dest_00);
  return dVar22 * 0.5;
}

Assistant:

double fcssx(double *b, int pq, void *params) {
	double value, ssq,temp;
	int p, q, ps, qs, s, d, D, offset,jm;
	int ip, iq, i, j, N,iter,ncond,M,naram;
	double *phi, *theta,*reg;

	value = ssq =  0.0;
	
	xlik_css_object obj = (xlik_css_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);

	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	M = obj->M;
	d = obj->d;
	D = obj->D;

	offset = obj->offset;
	ncond = p + s* ps;
	naram = p + q + ps + qs;

	//ncond = ncond + ncond1;

	reg = &obj->x[offset+3*N];

	//printf("\n %d %d %d \n", s,ps, qs);

	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);



	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	//mdisplay(theta, 1, q + s*qs);
	//mdisplay(b, 1, p + q + ps + qs);
	for (i = 0; i < ncond; ++i) {
		obj->x[offset+N + i] = 0.0;
	}


	if (obj->M > 0) {
		for (i = 0; i < N; ++i) {
			temp = obj->x[offset + 2 * N + i];
			for(j = 0; j < M;++j) {
				temp -= reg[j*N+i]*b[naram+j];
			}
			obj->x[offset + i] = temp;
		}
	}
	iter = 0;
	ssq = 0.0;
	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[offset+i];

		for (j = 0; j < ip; ++j) {
			temp = temp - phi[j] * obj->x[offset + i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[offset+N + i - j - 1];
		}

		obj->x[offset+N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	obj->Nmncond = iter;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	free(phi);
	free(theta);
	return value;
}